

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_uniform_block_active_visitor.cpp
# Opt level: O0

ir_visitor_status __thiscall
link_uniform_block_active_visitor::visit
          (link_uniform_block_active_visitor *this,ir_dereference_variable *ir)

{
  ir_variable *this_00;
  gl_shader_program *prog;
  bool bVar1;
  link_uniform_block_active *plVar2;
  glsl_type *pgVar3;
  byte local_39;
  link_uniform_block_active *b;
  ir_variable *var;
  ir_dereference_variable *ir_local;
  link_uniform_block_active_visitor *this_local;
  
  this_00 = ir->var;
  bVar1 = ir_variable::is_in_buffer_block(this_00);
  if (bVar1) {
    bVar1 = ir_variable::is_interface_instance(this_00);
    local_39 = 1;
    if (bVar1) {
      bVar1 = glsl_type::is_array(this_00->type);
      local_39 = bVar1 ^ 0xff;
    }
    if ((local_39 & 1) == 0) {
      __assert_fail("!var->is_interface_instance() || !var->type->is_array()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                    ,0x115,
                    "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                   );
    }
    plVar2 = process_block(this->mem_ctx,this->ht,this_00);
    if (plVar2 == (link_uniform_block_active *)0x0) {
      prog = this->prog;
      pgVar3 = ir_variable::get_interface_type(this_00);
      linker_error(prog,"uniform block `%s\' has mismatching definitions",pgVar3->name);
      (this->super_ir_hierarchical_visitor).field_0x31 = 0;
      this_local._4_4_ = visit_stop;
    }
    else {
      if (plVar2->array != (uniform_block_array_elements *)0x0) {
        __assert_fail("b->array == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                      ,0x122,
                      "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                     );
      }
      if (plVar2->type == (glsl_type *)0x0) {
        __assert_fail("b->type != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                      ,0x123,
                      "virtual ir_visitor_status link_uniform_block_active_visitor::visit(ir_dereference_variable *)"
                     );
      }
      this_local._4_4_ = visit_continue;
    }
  }
  else {
    this_local._4_4_ = visit_continue;
  }
  return this_local._4_4_;
}

Assistant:

ir_visitor_status
link_uniform_block_active_visitor::visit(ir_dereference_variable *ir)
{
   ir_variable *var = ir->var;

   if (!var->is_in_buffer_block())
      return visit_continue;

   assert(!var->is_interface_instance() || !var->type->is_array());

   /* Process the block.  Bail if there was an error. */
   link_uniform_block_active *const b =
      process_block(this->mem_ctx, this->ht, var);
   if (b == NULL) {
      linker_error(this->prog,
                   "uniform block `%s' has mismatching definitions",
                   var->get_interface_type()->name);
      this->success = false;
      return visit_stop;
   }

   assert(b->array == NULL);
   assert(b->type != NULL);

   return visit_continue;
}